

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.cc
# Opt level: O3

ostream * fizplex::operator<<(ostream *os,SVector *vec)

{
  pointer n;
  
  n = (vec->values).
      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
      _M_impl.super__Vector_impl_data._M_start;
  if (n != (vec->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      operator<<(os,n);
      n = n + 1;
    } while (n != (vec->values).
                  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, SVector const &vec) {
  for (auto it = vec.cbegin(); it != vec.cend(); ++it) {
    os << *it;
  }
  return os;
}